

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picohttpparser.c
# Opt level: O0

char * parse_response(char *buf,char *buf_end,int *minor_version,int *status,char **msg,
                     size_t *msg_len,phr_header *headers,size_t *num_headers,size_t max_headers,
                     int *ret)

{
  char *pcVar1;
  char *pcVar2;
  int res_;
  size_t *msg_len_local;
  char **msg_local;
  int *status_local;
  int *minor_version_local;
  char *buf_end_local;
  char *buf_local;
  
  pcVar1 = parse_http_version(buf,buf_end,minor_version,ret);
  if (pcVar1 == (char *)0x0) {
    buf_local = (char *)0x0;
  }
  else if (*pcVar1 == ' ') {
    do {
      buf_end_local = pcVar1;
      pcVar1 = buf_end_local + 1;
      if (pcVar1 == buf_end) {
        *ret = -2;
        return (char *)0x0;
      }
    } while (*pcVar1 == ' ');
    if ((long)buf_end - (long)pcVar1 < 4) {
      *ret = -2;
      buf_local = (char *)0x0;
    }
    else if ((*pcVar1 < '0') || ('9' < *pcVar1)) {
      *ret = -1;
      buf_local = (char *)0x0;
    }
    else {
      pcVar2 = buf_end_local + 2;
      *status = (*pcVar1 + -0x30) * 100;
      if ((*pcVar2 < '0') || ('9' < *pcVar2)) {
        *ret = -1;
        buf_local = (char *)0x0;
      }
      else {
        pcVar1 = buf_end_local + 3;
        *status = (*pcVar2 + -0x30) * 10 + *status;
        if ((*pcVar1 < '0') || ('9' < *pcVar1)) {
          *ret = -1;
          buf_local = (char *)0x0;
        }
        else {
          *status = *pcVar1 + -0x30 + *status;
          pcVar1 = get_token_to_eol(buf_end_local + 4,buf_end,msg,msg_len,ret);
          if (pcVar1 == (char *)0x0) {
            buf_local = (char *)0x0;
          }
          else {
            if (*msg_len != 0) {
              if (**msg != ' ') {
                *ret = -1;
                return (char *)0x0;
              }
              do {
                *msg = *msg + 1;
                *msg_len = *msg_len - 1;
              } while (**msg == ' ');
            }
            buf_local = parse_headers(pcVar1,buf_end,headers,num_headers,max_headers,ret);
          }
        }
      }
    }
  }
  else {
    *ret = -1;
    buf_local = (char *)0x0;
  }
  return buf_local;
}

Assistant:

static const char *parse_response(const char *buf, const char *buf_end, int *minor_version, int *status, const char **msg,
                                  size_t *msg_len, struct phr_header *headers, size_t *num_headers, size_t max_headers, int *ret)
{
    /* parse "HTTP/1.x" */
    if ((buf = parse_http_version(buf, buf_end, minor_version, ret)) == NULL) {
        return NULL;
    }
    /* skip space */
    if (*buf != ' ') {
        *ret = -1;
        return NULL;
    }
    do {
        ++buf;
        CHECK_EOF();
    } while (*buf == ' ');
    /* parse status code, we want at least [:digit:][:digit:][:digit:]<other char> to try to parse */
    if (buf_end - buf < 4) {
        *ret = -2;
        return NULL;
    }
    PARSE_INT_3(status);

    /* get message includig preceding space */
    if ((buf = get_token_to_eol(buf, buf_end, msg, msg_len, ret)) == NULL) {
        return NULL;
    }
    if (*msg_len == 0) {
        /* ok */
    } else if (**msg == ' ') {
        /* Remove preceding space. Successful return from `get_token_to_eol` guarantees that we would hit something other than SP
         * before running past the end of the given buffer. */
        do {
            ++*msg;
            --*msg_len;
        } while (**msg == ' ');
    } else {
        /* garbage found after status code */
        *ret = -1;
        return NULL;
    }

    return parse_headers(buf, buf_end, headers, num_headers, max_headers, ret);
}